

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_socket_unix.cxx
# Opt level: O2

bool ndiSocketSleep(NDISocketHandle socket,int milliseconds)

{
  timespec ts;
  timespec local_10;
  
  local_10.tv_sec = (__time_t)(milliseconds / 1000);
  local_10.tv_nsec = (long)((milliseconds % 1000) * 1000000);
  nanosleep(&local_10,(timespec *)0x0);
  return true;
}

Assistant:

ndicapiExport bool ndiSocketSleep(NDISocketHandle socket, int milliseconds)
{
#if _POSIX_C_SOURCE >= 199309L
  struct timespec ts;
  ts.tv_sec = milliseconds / 1000;
  ts.tv_nsec = (milliseconds % 1000) * 1000000;
  nanosleep(&ts, NULL);
#else
  usleep(milliseconds * 1000);
#endif
  return true;
}